

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslerror.cpp
# Opt level: O2

size_t qHash(QSslError *key,size_t seed)

{
  result_type rVar1;
  long in_FS_OFFSET;
  QHashCombine hash;
  QSslError local_38;
  QHashCombine local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_29 = (QHashCombine)0xaa;
  local_38.d._M_t.super___uniq_ptr_impl<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>.
  _M_t.super__Tuple_impl<0UL,_QSslErrorPrivate_*,_std::default_delete<QSslErrorPrivate>_>.
  super__Head_base<0UL,_QSslErrorPrivate_*,_false>._M_head_impl._0_4_ =
       ((key->d)._M_t.
        super___uniq_ptr_impl<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>._M_t.
        super__Tuple_impl<0UL,_QSslErrorPrivate_*,_std::default_delete<QSslErrorPrivate>_>.
        super__Head_base<0UL,_QSslErrorPrivate_*,_false>._M_head_impl)->error;
  rVar1 = QtPrivate::QHashCombine::operator()(&local_29,seed,(SslError *)&local_38);
  QSslError::certificate(&local_38);
  rVar1 = QtPrivate::QHashCombine::operator()(&local_29,rVar1,(QSslCertificate *)&local_38);
  QSslCertificate::~QSslCertificate((QSslCertificate *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return rVar1;
  }
  __stack_chk_fail();
}

Assistant:

size_t qHash(const QSslError &key, size_t seed) noexcept
{
    QtPrivate::QHashCombine hash;
    seed = hash(seed, key.error());
    seed = hash(seed, key.certificate());
    return seed;
}